

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

int __thiscall Rml::Event::GetParameter<int>(Event *this,String *key,int *default_value)

{
  int iVar1;
  int *default_value_local;
  String *key_local;
  Event *this_local;
  
  iVar1 = Get<int>(&this->parameters,key,default_value);
  return iVar1;
}

Assistant:

T GetParameter(const String& key, const T& default_value) const
	{
		return Get(parameters, key, default_value);
	}